

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O3

void __thiscall
duckdb::WindowBoundariesState::FrameBegin
          (WindowBoundariesState *this,DataChunk *bounds,idx_t row_idx,idx_t count,
          WindowInputExpression *boundary_begin,ValidityMask *order_mask,
          optional_ptr<duckdb::WindowCursor,_true> range)

{
  FrameBounds *prev;
  size_type *psVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  idx_t *piVar4;
  __node_base_ptr p_Var5;
  _Head_base<0UL,_duckdb::WindowCursor_*,_false> __ptr;
  unsigned_long *puVar6;
  _Hash_node_base *order_end;
  size_type sVar7;
  WindowCursor *pWVar8;
  undefined1 auVar9 [16];
  WindowBoundariesState *pWVar10;
  bool bVar11;
  reference pvVar12;
  reference pvVar13;
  unsigned_long uVar14;
  idx_t iVar15;
  type pWVar16;
  idx_t iVar17;
  OutOfRangeException *pOVar18;
  InternalException *this_00;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  data_ptr_t pdVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  idx_t local_98;
  unsigned_long n;
  undefined1 local_70 [16];
  size_type local_60;
  optional_ptr<duckdb::WindowCursor,_true> *local_58;
  idx_t *local_50;
  __node_base_ptr local_48;
  unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *local_40;
  WindowBoundariesState *local_38;
  long lVar25;
  
  local_38 = this;
  pvVar12 = vector<duckdb::Vector,_true>::operator[](&bounds->data,0);
  psVar1 = (size_type *)pvVar12->data;
  pvVar12 = vector<duckdb::Vector,_true>::operator[](&bounds->data,1);
  pdVar2 = pvVar12->data;
  pvVar12 = vector<duckdb::Vector,_true>::operator[](&bounds->data,2);
  pdVar3 = pvVar12->data;
  pvVar12 = vector<duckdb::Vector,_true>::operator[](&bounds->data,4);
  piVar4 = (idx_t *)pvVar12->data;
  pvVar12 = vector<duckdb::Vector,_true>::operator[](&bounds->data,5);
  p_Var5 = (__node_base_ptr)pvVar12->data;
  pvVar12 = vector<duckdb::Vector,_true>::operator[](&bounds->data,6);
  pWVar10 = local_38;
  pdVar22 = pvVar12->data;
  local_60 = *psVar1;
  (local_38->prev).start = *piVar4;
  (local_38->prev).end = (idx_t)p_Var5->_M_nxt;
  local_50 = piVar4;
  local_48 = p_Var5;
  if (((local_38->has_preceding_range != false) || (local_38->has_following_range == true)) &&
     ((local_38->range_lo).ptr != range.ptr)) {
    (local_38->range_lo).ptr = range.ptr;
    optional_ptr<duckdb::WindowCursor,_true>::CheckValid(&local_38->range_lo);
    WindowCursor::Copy((WindowCursor *)&n);
    uVar14 = n;
    n = 0;
    __ptr._M_head_impl =
         (pWVar10->range_hi).
         super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
         super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>.
         super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl;
    (pWVar10->range_hi).
    super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
    super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>.
    super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl = (WindowCursor *)uVar14;
    if ((__ptr._M_head_impl != (WindowCursor *)0x0) &&
       (::std::default_delete<duckdb::WindowCursor>::operator()
                  ((default_delete<duckdb::WindowCursor> *)&pWVar10->range_hi,__ptr._M_head_impl),
       n != 0)) {
      ::std::default_delete<duckdb::WindowCursor>::operator()
                ((default_delete<duckdb::WindowCursor> *)&n,(WindowCursor *)n);
    }
  }
  auVar9 = _DAT_012b0ff0;
  if (pWVar10->start_boundary < (EXPR_FOLLOWING_RANGE|CURRENT_ROW_ROWS)) {
    prev = &pWVar10->prev;
    switch(pWVar10->start_boundary) {
    default:
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      n = (unsigned_long)local_70;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&n,"Unsupported window start boundary","");
      InternalException::InternalException(this_00,(string *)&n);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    case UNBOUNDED_PRECEDING:
      pvVar12 = vector<duckdb::Vector,_true>::operator[](&bounds->data,6);
      pvVar13 = vector<duckdb::Vector,_true>::operator[](&bounds->data,0);
      Vector::Reference(pvVar12,pvVar13);
      return;
    case CURRENT_ROW_RANGE:
    case CURRENT_ROW_GROUPS:
      pvVar12 = vector<duckdb::Vector,_true>::operator[](&bounds->data,6);
      pvVar13 = vector<duckdb::Vector,_true>::operator[](&bounds->data,2);
      Vector::Reference(pvVar12,pvVar13);
      pdVar22 = pdVar3;
      goto LAB_00cb7439;
    case CURRENT_ROW_ROWS:
      if (count == 0) {
        return;
      }
      lVar20 = count - 1;
      auVar23._8_4_ = (int)lVar20;
      auVar23._0_8_ = lVar20;
      auVar23._12_4_ = (int)((ulong)lVar20 >> 0x20);
      lVar20 = 1;
      auVar23 = auVar23 ^ _DAT_012b0ff0;
      auVar24 = _DAT_012b0fe0;
      do {
        auVar26 = auVar24 ^ auVar9;
        if ((bool)(~(auVar26._4_4_ == auVar23._4_4_ && auVar23._0_4_ < auVar26._0_4_ ||
                    auVar23._4_4_ < auVar26._4_4_) & 1)) {
          *(idx_t *)(pdVar22 + lVar20 * 8 + -8) = row_idx;
        }
        if ((auVar26._12_4_ != auVar23._12_4_ || auVar26._8_4_ <= auVar23._8_4_) &&
            auVar26._12_4_ <= auVar23._12_4_) {
          *(idx_t *)(pdVar22 + lVar20 * 8) = row_idx + 1;
        }
        lVar25 = auVar24._8_8_;
        auVar24._0_8_ = auVar24._0_8_ + 2;
        auVar24._8_8_ = lVar25 + 2;
        lVar25 = lVar20 - (count + 1 & 0xfffffffffffffffe);
        lVar20 = lVar20 + 2;
        row_idx = row_idx + 2;
      } while (lVar25 != -1);
      break;
    case EXPR_PRECEDING_ROWS:
      if (count == 0) {
        return;
      }
      iVar17 = 0;
      do {
        pvVar12 = vector<duckdb::Vector,_true>::operator[]
                            (&boundary_begin->chunk->data,boundary_begin->col_idx);
        iVar15 = 0;
        if (boundary_begin->scalar == false) {
          iVar15 = iVar17;
        }
        bVar11 = TrySubtractOperator::Operation<long,long,long>
                           (row_idx + iVar17,*(int64_t *)(pvVar12->data + iVar15 * 8),(int64_t *)&n)
        ;
        if (bVar11) {
          uVar14 = n;
          if ((long)n < 1) {
            uVar14 = 0;
          }
        }
        else {
          uVar14 = psVar1[iVar17];
        }
        *(unsigned_long *)(pdVar22 + iVar17 * 8) = uVar14;
        iVar17 = iVar17 + 1;
      } while (count != iVar17);
      break;
    case EXPR_FOLLOWING_ROWS:
      if (count == 0) {
        return;
      }
      iVar17 = 0;
      do {
        pvVar12 = vector<duckdb::Vector,_true>::operator[]
                            (&boundary_begin->chunk->data,boundary_begin->col_idx);
        iVar15 = 0;
        if (boundary_begin->scalar == false) {
          iVar15 = iVar17;
        }
        bVar11 = TryAddOperator::Operation<long,long,long>
                           (row_idx + iVar17,*(int64_t *)(pvVar12->data + iVar15 * 8),(int64_t *)&n)
        ;
        if (bVar11) {
          uVar14 = n;
          if ((long)n < 1) {
            uVar14 = 0;
          }
        }
        else {
          uVar14 = psVar1[iVar17];
        }
        *(unsigned_long *)(pdVar22 + iVar17 * 8) = uVar14;
        iVar17 = iVar17 + 1;
      } while (count != iVar17);
      break;
    case EXPR_PRECEDING_RANGE:
      if (count == 0) {
        return;
      }
      local_58 = (optional_ptr<duckdb::WindowCursor,_true> *)&pWVar10->range_hi;
      uVar21 = 0;
      local_98 = row_idx;
      do {
        pvVar12 = vector<duckdb::Vector,_true>::operator[]
                            (&boundary_begin->chunk->data,boundary_begin->col_idx);
        puVar6 = (pvVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (boundary_begin->scalar == true) {
          if ((puVar6 != (unsigned_long *)0x0) && ((*puVar6 & 1) == 0)) goto LAB_00cb7183;
LAB_00cb70e4:
          iVar17 = local_50[uVar21];
          (pWVar10->prev).end = (idx_t)local_48[uVar21]._M_nxt;
          sVar7 = psVar1[uVar21];
          if (sVar7 != local_60) {
            prev->start = iVar17;
            local_60 = sVar7;
          }
          optional_ptr<duckdb::WindowCursor,_true>::CheckValid(&pWVar10->range_lo);
          pWVar8 = (pWVar10->range_lo).ptr;
          pWVar16 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                    ::operator*((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                                 *)local_58);
          iVar17 = FindOrderedRangeBound<true>
                             (pWVar8,pWVar16,pWVar10->range_sense,iVar17,local_98 + 1,
                              pWVar10->start_boundary,boundary_begin,uVar21,prev);
          (pWVar10->prev).start = iVar17;
        }
        else {
          if ((puVar6 == (unsigned_long *)0x0) ||
             ((puVar6[uVar21 >> 6] >> (uVar21 & 0x3f) & 1) != 0)) goto LAB_00cb70e4;
LAB_00cb7183:
          iVar17 = *(idx_t *)(pdVar3 + uVar21 * 8);
        }
        local_98 = local_98 + 1;
        *(idx_t *)(pdVar22 + uVar21 * 8) = iVar17;
        uVar21 = uVar21 + 1;
      } while (count != uVar21);
      break;
    case EXPR_FOLLOWING_RANGE:
      if (count == 0) {
        return;
      }
      local_58 = &pWVar10->range_lo;
      local_40 = &pWVar10->range_hi;
      uVar21 = 0;
      do {
        pvVar12 = vector<duckdb::Vector,_true>::operator[]
                            (&boundary_begin->chunk->data,boundary_begin->col_idx);
        puVar6 = (pvVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (boundary_begin->scalar == true) {
          if ((puVar6 != (unsigned_long *)0x0) && ((*puVar6 & 1) == 0)) goto LAB_00cb735f;
LAB_00cb72c2:
          order_end = local_48[uVar21]._M_nxt;
          (pWVar10->prev).end = (idx_t)order_end;
          sVar7 = psVar1[uVar21];
          if (sVar7 != local_60) {
            prev->start = local_50[uVar21];
            local_60 = sVar7;
          }
          optional_ptr<duckdb::WindowCursor,_true>::CheckValid(local_58);
          pWVar8 = (pWVar10->range_lo).ptr;
          pWVar16 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                    ::operator*(local_40);
          iVar17 = FindOrderedRangeBound<true>
                             (pWVar8,pWVar16,pWVar10->range_sense,row_idx + uVar21,(idx_t)order_end,
                              pWVar10->start_boundary,boundary_begin,uVar21,prev);
          (pWVar10->prev).start = iVar17;
        }
        else {
          if ((puVar6 == (unsigned_long *)0x0) ||
             ((puVar6[uVar21 >> 6] >> (uVar21 & 0x3f) & 1) != 0)) goto LAB_00cb72c2;
LAB_00cb735f:
          iVar17 = *(idx_t *)(pdVar3 + uVar21 * 8);
        }
        *(idx_t *)(pdVar22 + uVar21 * 8) = iVar17;
        uVar21 = uVar21 + 1;
      } while (count != uVar21);
      break;
    case EXPR_PRECEDING_GROUPS:
      if (count == 0) {
        return;
      }
      uVar21 = 0;
      do {
        pvVar12 = vector<duckdb::Vector,_true>::operator[]
                            (&boundary_begin->chunk->data,boundary_begin->col_idx);
        puVar6 = (pvVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (boundary_begin->scalar == true) {
          if ((puVar6 != (unsigned_long *)0x0) && ((*puVar6 & 1) == 0)) goto LAB_00cb6efb;
LAB_00cb6ea1:
          iVar15 = *(idx_t *)(pdVar3 + uVar21 * 8);
          iVar17 = psVar1[uVar21];
          pvVar12 = vector<duckdb::Vector,_true>::operator[]
                              (&boundary_begin->chunk->data,boundary_begin->col_idx);
          uVar19 = 0;
          if (boundary_begin->scalar == false) {
            uVar19 = uVar21;
          }
          uVar14 = *(unsigned_long *)(pvVar12->data + uVar19 * 8);
          if ((long)uVar14 < 0) {
            pOVar18 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
            n = (unsigned_long)local_70;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&n,"Invalid GROUPS PRECEDING value","");
            OutOfRangeException::OutOfRangeException(pOVar18,(string *)&n);
            __cxa_throw(pOVar18,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error)
            ;
          }
          if (uVar14 != 0) {
            n = uVar14;
            iVar15 = FindPrevStart(order_mask,iVar17,iVar15,&n);
          }
        }
        else {
          if ((puVar6 == (unsigned_long *)0x0) ||
             ((puVar6[uVar21 >> 6] >> (uVar21 & 0x3f) & 1) != 0)) goto LAB_00cb6ea1;
LAB_00cb6efb:
          iVar15 = *(idx_t *)(pdVar3 + uVar21 * 8);
        }
        *(idx_t *)(pdVar22 + uVar21 * 8) = iVar15;
        uVar21 = uVar21 + 1;
      } while (count != uVar21);
      break;
    case EXPR_FOLLOWING_GROUPS:
      if (count == 0) {
        return;
      }
      uVar21 = 0;
      do {
        pvVar12 = vector<duckdb::Vector,_true>::operator[]
                            (&boundary_begin->chunk->data,boundary_begin->col_idx);
        puVar6 = (pvVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (boundary_begin->scalar == true) {
          if ((puVar6 != (unsigned_long *)0x0) && ((*puVar6 & 1) == 0)) goto LAB_00cb704f;
LAB_00cb6ff0:
          iVar15 = *(idx_t *)(pdVar3 + uVar21 * 8);
          iVar17 = *(idx_t *)(pdVar2 + uVar21 * 8);
          pvVar12 = vector<duckdb::Vector,_true>::operator[]
                              (&boundary_begin->chunk->data,boundary_begin->col_idx);
          uVar19 = 0;
          if (boundary_begin->scalar == false) {
            uVar19 = uVar21;
          }
          uVar14 = *(unsigned_long *)(pvVar12->data + uVar19 * 8);
          if ((long)uVar14 < 0) {
            pOVar18 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
            n = (unsigned_long)local_70;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&n,"Invalid GROUPS FOLLOWING value","");
            OutOfRangeException::OutOfRangeException(pOVar18,(string *)&n);
            __cxa_throw(pOVar18,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error)
            ;
          }
          if (uVar14 != 0) {
            n = uVar14;
            iVar15 = FindNextStart(order_mask,iVar15 + 1,iVar17,&n);
          }
        }
        else {
          if ((puVar6 == (unsigned_long *)0x0) ||
             ((puVar6[uVar21 >> 6] >> (uVar21 & 0x3f) & 1) != 0)) goto LAB_00cb6ff0;
LAB_00cb704f:
          iVar15 = *(idx_t *)(pdVar3 + uVar21 * 8);
        }
        *(idx_t *)(pdVar22 + uVar21 * 8) = iVar15;
        uVar21 = uVar21 + 1;
      } while (count != uVar21);
    }
  }
  else {
LAB_00cb7439:
    if (count == 0) {
      return;
    }
  }
  iVar17 = 0;
  do {
    uVar21 = psVar1[iVar17];
    if (psVar1[iVar17] < *(ulong *)(pdVar22 + iVar17 * 8)) {
      uVar21 = *(ulong *)(pdVar22 + iVar17 * 8);
    }
    uVar19 = *(ulong *)(pdVar2 + iVar17 * 8);
    if (uVar19 <= uVar21) {
      uVar21 = uVar19;
    }
    *(ulong *)(pdVar22 + iVar17 * 8) = uVar21;
    iVar17 = iVar17 + 1;
  } while (count != iVar17);
  return;
}

Assistant:

void WindowBoundariesState::FrameBegin(DataChunk &bounds, idx_t row_idx, const idx_t count,
                                       WindowInputExpression &boundary_begin, const ValidityMask &order_mask,
                                       optional_ptr<WindowCursor> range) {
	auto partition_begin_data = FlatVector::GetData<idx_t>(bounds.data[PARTITION_BEGIN]);
	auto partition_end_data = FlatVector::GetData<const idx_t>(bounds.data[PARTITION_END]);
	auto peer_begin_data = FlatVector::GetData<idx_t>(bounds.data[PEER_BEGIN]);
	auto valid_begin_data = FlatVector::GetData<const idx_t>(bounds.data[VALID_BEGIN]);
	auto valid_end_data = FlatVector::GetData<const idx_t>(bounds.data[VALID_END]);
	auto frame_begin_data = FlatVector::GetData<idx_t>(bounds.data[FRAME_BEGIN]);

	idx_t window_start = NumericLimits<idx_t>::Maximum();

	//	Reset previous range hints
	idx_t prev_partition = partition_begin_data[0];
	prev.start = valid_begin_data[0];
	prev.end = valid_end_data[0];

	if (has_preceding_range || has_following_range) {
		if (range_lo.get() != range.get()) {
			range_lo = range.get();
			range_hi = range_lo->Copy();
		}
	}

	switch (start_boundary) {
	case WindowBoundary::UNBOUNDED_PRECEDING:
		bounds.data[FRAME_BEGIN].Reference(bounds.data[PARTITION_BEGIN]);
		// No need to clamp
		return;
	case WindowBoundary::CURRENT_ROW_ROWS:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			frame_begin_data[chunk_idx] = row_idx;
		}
		break;
	case WindowBoundary::CURRENT_ROW_RANGE:
	case WindowBoundary::CURRENT_ROW_GROUPS:
		// in RANGE or GROUPS mode it means that the frame starts or ends with the current row's
		// first or last peer in the ORDER BY ordering
		bounds.data[FRAME_BEGIN].Reference(bounds.data[PEER_BEGIN]);
		frame_begin_data = peer_begin_data;
		break;
	case WindowBoundary::EXPR_PRECEDING_ROWS:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			int64_t computed_start;
			if (!TrySubtractOperator::Operation(static_cast<int64_t>(row_idx),
			                                    boundary_begin.GetCell<int64_t>(chunk_idx), computed_start)) {
				window_start = partition_begin_data[chunk_idx];
			} else {
				window_start = UnsafeNumericCast<idx_t>(MaxValue<int64_t>(computed_start, 0));
			}
			frame_begin_data[chunk_idx] = window_start;
		}
		break;
	case WindowBoundary::EXPR_FOLLOWING_ROWS:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			int64_t computed_start;
			if (!TryAddOperator::Operation(static_cast<int64_t>(row_idx), boundary_begin.GetCell<int64_t>(chunk_idx),
			                               computed_start)) {
				window_start = partition_begin_data[chunk_idx];
			} else {
				window_start = UnsafeNumericCast<idx_t>(MaxValue<int64_t>(computed_start, 0));
			}
			frame_begin_data[chunk_idx] = window_start;
		}
		break;
	case WindowBoundary::EXPR_PRECEDING_RANGE:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			if (boundary_begin.CellIsNull(chunk_idx)) {
				window_start = peer_begin_data[chunk_idx];
			} else {
				const auto valid_start = valid_begin_data[chunk_idx];
				prev.end = valid_end_data[chunk_idx];
				const auto cur_partition = partition_begin_data[chunk_idx];
				if (cur_partition != prev_partition) {
					prev.start = valid_start;
					prev_partition = cur_partition;
				}
				window_start = FindOrderedRangeBound<true>(*range_lo, *range_hi, range_sense, valid_start, row_idx + 1,
				                                           start_boundary, boundary_begin, chunk_idx, prev);
				prev.start = window_start;
			}
			frame_begin_data[chunk_idx] = window_start;
		}
		break;
	case WindowBoundary::EXPR_FOLLOWING_RANGE:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			if (boundary_begin.CellIsNull(chunk_idx)) {
				window_start = peer_begin_data[chunk_idx];
			} else {
				const auto valid_end = valid_end_data[chunk_idx];
				prev.end = valid_end;
				const auto cur_partition = partition_begin_data[chunk_idx];
				if (cur_partition != prev_partition) {
					prev.start = valid_begin_data[chunk_idx];
					prev_partition = cur_partition;
				}
				window_start = FindOrderedRangeBound<true>(*range_lo, *range_hi, range_sense, row_idx, valid_end,
				                                           start_boundary, boundary_begin, chunk_idx, prev);
				prev.start = window_start;
			}
			frame_begin_data[chunk_idx] = window_start;
		}
		break;
	case WindowBoundary::EXPR_PRECEDING_GROUPS:
		// In GROUPS mode, the offset is an integer indicating that the frame starts or ends that many peer groups
		// before or after the current row's peer group, where a peer group is a group of rows that are equivalent
		// according to the window's ORDER BY clause.
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			if (boundary_begin.CellIsNull(chunk_idx)) {
				window_start = peer_begin_data[chunk_idx];
			} else {
				//	Count peer groups backwards.
				const auto peer_begin = peer_begin_data[chunk_idx];
				const auto partition_begin = partition_begin_data[chunk_idx];
				const auto boundary = boundary_begin.GetCell<int64_t>(chunk_idx);
				if (boundary < 0) {
					throw OutOfRangeException("Invalid GROUPS PRECEDING value");
				} else if (!boundary) {
					window_start = peer_begin;
				} else {
					auto n = UnsafeNumericCast<idx_t>(boundary);
					window_start = FindPrevStart(order_mask, partition_begin, peer_begin, n);
				}
			}
			frame_begin_data[chunk_idx] = window_start;
		}
		break;
	case WindowBoundary::EXPR_FOLLOWING_GROUPS:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			if (boundary_begin.CellIsNull(chunk_idx)) {
				window_start = peer_begin_data[chunk_idx];
			} else {
				//	Count peer groups forward.
				const auto peer_begin = peer_begin_data[chunk_idx];
				const auto partition_end = partition_end_data[chunk_idx];
				const auto boundary = boundary_begin.GetCell<int64_t>(chunk_idx);
				if (boundary < 0) {
					throw OutOfRangeException("Invalid GROUPS FOLLOWING value");
				} else if (!boundary) {
					window_start = peer_begin;
				} else {
					auto n = UnsafeNumericCast<idx_t>(boundary);
					window_start = FindNextStart(order_mask, peer_begin + 1, partition_end, n);
				}
			}
			frame_begin_data[chunk_idx] = window_start;
		}
		break;
	case WindowBoundary::UNBOUNDED_FOLLOWING:
	case WindowBoundary::INVALID:
		throw InternalException("Unsupported window start boundary");
	}

	ClampFrame(count, frame_begin_data, partition_begin_data, partition_end_data);
}